

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_ManualCompaction_Test::TestBody(DBTest_ManualCompaction_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DB *pDVar3;
  char cVar4;
  size_type sVar5;
  int line;
  pointer *__ptr;
  char *pcVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  string local_78;
  string local_58;
  AssertHelper local_38;
  
  local_78._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_58,"config::kMaxMemCompactLevel","2",&config::kMaxMemCompactLevel,
             (int *)&local_78);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_78._M_dataplus._M_p + 0x10),
               "Need to update this test to match kMaxMemCompactLevel",0x35);
    if ((undefined8 *)local_58._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_58._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x635,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if ((undefined8 *)local_58._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_58._M_string_length !=
        (undefined8 *)(local_58._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_58._M_string_length);
    }
    operator_delete((void *)local_58._M_string_length);
  }
  if ((char)local_58._M_dataplus._M_p == '\0') {
    return;
  }
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"p","");
  paVar2 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"q","");
  DBTest::MakeTables(&this->super_DBTest,3,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  cVar4 = (char)local_78._M_dataplus._M_p;
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x639,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)local_78._M_string_length);
  }
  if (cVar4 == '\0') {
    return;
  }
  pcVar6 = "";
  local_58._M_dataplus._M_p = "";
  local_58._M_string_length = 0;
  local_78._M_dataplus._M_p = "c";
  local_78._M_string_length = 1;
  (*((this->super_DBTest).db_)->_vptr_DB[0xb])();
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  cVar4 = (char)local_78._M_dataplus._M_p;
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x63d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  sVar5 = local_78._M_string_length;
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  if (cVar4 == '\0') {
    return;
  }
  local_58._M_dataplus._M_p = "r";
  local_58._M_string_length = 1;
  local_78._M_dataplus._M_p = "z";
  local_78._M_string_length = 1;
  (*((this->super_DBTest).db_)->_vptr_DB[0xb])();
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  cVar4 = (char)local_78._M_dataplus._M_p;
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x641,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  sVar5 = local_78._M_string_length;
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  if (cVar4 == '\0') {
    return;
  }
  local_58._M_dataplus._M_p = "p1";
  local_58._M_string_length = 2;
  local_78._M_dataplus._M_p = "p9";
  local_78._M_string_length = 2;
  (*((this->super_DBTest).db_)->_vptr_DB[0xb])();
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"0,0,1\"","FilesPerLevel()",(char (*) [6])"0,0,1",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  cVar4 = (char)local_78._M_dataplus._M_p;
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x645,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
    }
  }
  sVar5 = local_78._M_string_length;
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  if (cVar4 == '\0') {
    return;
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"c","");
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"e","");
  DBTest::MakeTables(&this->super_DBTest,3,&local_58,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"1,1,2\"","FilesPerLevel()",(char (*) [6])"1,1,2",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  cVar4 = (char)local_78._M_dataplus._M_p;
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x649,pcVar6);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
  }
  sVar5 = local_78._M_string_length;
  if ((undefined8 *)local_78._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_78._M_string_length !=
        (undefined8 *)(local_78._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_78._M_string_length);
    }
    operator_delete((void *)sVar5);
  }
  if (cVar4 == '\0') {
    return;
  }
  local_58._M_dataplus._M_p = "b";
  local_58._M_string_length = 1;
  local_78._M_dataplus._M_p = "f";
  local_78._M_string_length = 1;
  (*((this->super_DBTest).db_)->_vptr_DB[0xb])();
  DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_78,"\"0,0,2\"","FilesPerLevel()",(char (*) [6])"0,0,2",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_78._M_string_length;
    }
    line = 0x64d;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_78);
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"a","");
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"z","");
    DBTest::MakeTables(&this->super_DBTest,1,&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&local_78,"\"0,1,2\"","FilesPerLevel()",(char (*) [6])"0,1,2",&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((char)local_78._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_78._M_string_length;
      }
      line = 0x651;
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_78);
      pDVar3 = (this->super_DBTest).db_;
      (*pDVar3->_vptr_DB[0xb])(pDVar3,0,0);
      DBTest::FilesPerLevel_abi_cxx11_(&local_58,&this->super_DBTest);
      testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
                ((internal *)&local_78,"\"0,0,1\"","FilesPerLevel()",(char (*) [6])"0,0,1",&local_58
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((char)local_78._M_dataplus._M_p != '\0') goto LAB_0012949b;
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_78._M_string_length;
      }
      line = 0x653;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,line,pcVar6);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
  }
LAB_0012949b:
  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_78);
  return;
}

Assistant:

TEST_F(DBTest, ManualCompaction) {
  ASSERT_EQ(config::kMaxMemCompactLevel, 2)
      << "Need to update this test to match kMaxMemCompactLevel";

  MakeTables(3, "p", "q");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range falls before files
  Compact("", "c");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range falls after files
  Compact("r", "z");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range overlaps files
  Compact("p1", "p9");
  ASSERT_EQ("0,0,1", FilesPerLevel());

  // Populate a different range
  MakeTables(3, "c", "e");
  ASSERT_EQ("1,1,2", FilesPerLevel());

  // Compact just the new range
  Compact("b", "f");
  ASSERT_EQ("0,0,2", FilesPerLevel());

  // Compact all
  MakeTables(1, "a", "z");
  ASSERT_EQ("0,1,2", FilesPerLevel());
  db_->CompactRange(nullptr, nullptr);
  ASSERT_EQ("0,0,1", FilesPerLevel());
}